

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

ON_Color __thiscall ON_Layer::PerViewportPlotColor(ON_Layer *this,ON_UUID viewport_id)

{
  bool bVar1;
  uint uVar2;
  ON__LayerPerViewSettings *pOVar3;
  undefined1 in_R9B;
  ON_UUID viewport_id_00;
  ON__LayerPerViewSettings *vp_settings;
  ON_Layer *this_local;
  ON_UUID viewport_id_local;
  
  bVar1 = ExtensionBit(this->m_extension_bits,'\x01');
  if (((bVar1) ||
      (viewport_id_00.Data4[0] = '\0', viewport_id_00.Data4[1] = '\0',
      viewport_id_00.Data4[2] = '\0', viewport_id_00.Data4[3] = '\0', viewport_id_00.Data4[4] = '\0'
      , viewport_id_00.Data4[5] = '\0', viewport_id_00.Data4[6] = '\0',
      viewport_id_00.Data4[7] = '\0', viewport_id_00._0_8_ = viewport_id.Data4,
      pOVar3 = ON__LayerExtensions::ViewportSettings
                         ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                          viewport_id._0_8_,viewport_id_00,(bool)in_R9B),
      pOVar3 == (ON__LayerPerViewSettings *)0x0)) ||
     (uVar2 = ON_Color::operator_cast_to_unsigned_int(&pOVar3->m_plot_color), uVar2 == 0xffffffff))
  {
    viewport_id_local.Data4._0_4_ = PlotColor(this);
  }
  else {
    viewport_id_local.Data4._0_4_ = (pOVar3->m_plot_color).field_0;
  }
  return (ON_Color)(anon_union_4_2_6147a14e_for_ON_Color_15)viewport_id_local.Data4._0_4_;
}

Assistant:

ON_Color ON_Layer::PerViewportPlotColor( ON_UUID viewport_id ) const
{
  if ( !ExtensionBit(m_extension_bits,0x01) )
  {
    const ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, false );
    if ( 0 != vp_settings && vp_settings->m_plot_color != ON_UNSET_COLOR )
      return vp_settings->m_plot_color;
  }

  // no per viewport settings
  // 2-Nov-2009 Dale Fugier, modified to call default PlotColor()
  return PlotColor();
}